

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_Create(SUNComm comm,char *title,SUNProfiler *p)

{
  SUNErrCode SVar1;
  _func_SUNErrCode_SUNHashMapKeyValue_ptr *destroyKeyValue;
  sunTimerStruct *psVar2;
  size_t sVar3;
  void *pvVar4;
  undefined8 *in_RDX;
  char *in_RSI;
  int in_EDI;
  char *max_entries_env;
  int max_entries;
  SUNProfiler profiler;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  SUNErrCode local_4;
  
  destroyKeyValue = (_func_SUNErrCode_SUNHashMapKeyValue_ptr *)malloc(0x28);
  *in_RDX = destroyKeyValue;
  if (destroyKeyValue == (_func_SUNErrCode_SUNHashMapKeyValue_ptr *)0x0) {
    local_4 = 0;
  }
  else {
    psVar2 = sunTimerStructNew();
    *(sunTimerStruct **)(destroyKeyValue + 0x18) = psVar2;
    if (*(long *)(destroyKeyValue + 0x18) == 0) {
      free(destroyKeyValue);
      *in_RDX = 0;
      local_4 = -0x2704;
    }
    else {
      sunStartTiming((sunTimerStruct *)0x118af8);
      iVar5 = 0xa00;
      psVar2 = (sunTimerStruct *)getenv("SUNPROFILER_MAX_ENTRIES");
      if (psVar2 != (sunTimerStruct *)0x0) {
        iVar5 = atoi((char *)psVar2);
      }
      if (iVar5 < 1) {
        iVar5 = 0xa00;
      }
      SVar1 = SUNHashMap_New((int64_t)in_RDX,destroyKeyValue,
                             (SUNHashMap *)CONCAT44(iVar5,in_stack_ffffffffffffffd8));
      if (SVar1 == 0) {
        if (in_EDI == 0) {
          *(undefined4 *)destroyKeyValue = 0;
          sVar3 = strlen(in_RSI);
          pvVar4 = malloc(sVar3 + 1);
          *(void **)(destroyKeyValue + 8) = pvVar4;
          strcpy(*(char **)(destroyKeyValue + 8),in_RSI);
          *(undefined8 *)(destroyKeyValue + 0x20) = 0;
          sunStopTiming(psVar2);
          local_4 = 0;
        }
        else {
          free(destroyKeyValue);
          local_4 = -1;
        }
      }
      else {
        sunTimerStructFree(psVar2);
        free(destroyKeyValue);
        *in_RDX = 0;
        local_4 = -0x2704;
      }
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNProfiler_Create(SUNComm comm, const char* title, SUNProfiler* p)
{
  SUNProfiler profiler;
  int max_entries;
  char* max_entries_env;

  *p = profiler = (SUNProfiler)malloc(sizeof(struct SUNProfiler_));

  if (profiler == NULL) { return SUN_SUCCESS; }

  profiler->overhead = sunTimerStructNew();
  if (!profiler->overhead)
  {
    free(profiler);
    *p = profiler = NULL;
    return SUN_ERR_MALLOC_FAIL;
  }

  sunStartTiming(profiler->overhead);

  /* Check to see if max entries env variable was set, and use if it was. */
  max_entries     = 2560;
  max_entries_env = getenv("SUNPROFILER_MAX_ENTRIES");
  if (max_entries_env) { max_entries = atoi(max_entries_env); }
  if (max_entries <= 0) { max_entries = 2560; }

  /* Create the hashmap used to store the timers */
  if (SUNHashMap_New(max_entries, sunProfilerDestroyKeyValue, &profiler->map))
  {
    sunTimerStructFree((void*)profiler->overhead);
    free(profiler);
    *p = profiler = NULL;
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Attach the comm, duplicating it if MPI is used. */
#if SUNDIALS_MPI_ENABLED
  profiler->comm = SUN_COMM_NULL;
  if (comm != SUN_COMM_NULL) { MPI_Comm_dup(comm, &profiler->comm); }
#else
  if (comm != SUN_COMM_NULL)
  {
    free(profiler);
    return -1;
  }
  profiler->comm = SUN_COMM_NULL;
#endif

  /* Copy the title of the profiler (note strlen does not include terminating
     null character hence the +1) */
  profiler->title = malloc((strlen(title) + 1) * sizeof(char));
  strcpy(profiler->title, title);

  /* Initialize the overall timer to 0. */
  profiler->sundials_time = 0.0;

  SUNDIALS_MARK_BEGIN(profiler, SUNDIALS_ROOT_TIMER);
  sunStopTiming(profiler->overhead);

  return SUN_SUCCESS;
}